

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

BailOutInstrTemplate<IR::ProfiledInstr> * __thiscall
IR::BailOutInstrTemplate<IR::ProfiledInstr>::CloneBailOut
          (BailOutInstrTemplate<IR::ProfiledInstr> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BailOutInstrTemplate<IR::ProfiledInstr> *pBVar4;
  BailOutInstrTemplate<IR::ProfiledInstr> *bailOutInstr;
  BailOutInstrTemplate<IR::ProfiledInstr> *this_local;
  
  if ((*(uint *)&((this->super_ProfiledInstr).super_Instr.m_func)->field_0x240 >> 4 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x5ed,"(this->m_func->hasBailout)","this->m_func->hasBailout");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((this->bailOutInfo->wasCloned & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x5ee,"(!this->bailOutInfo->wasCloned)","!this->bailOutInfo->wasCloned");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pBVar4 = New((this->super_ProfiledInstr).super_Instr.m_opcode,this->bailOutKind,this->bailOutInfo,
               this->bailOutInfo->bailOutFunc);
  (pBVar4->super_ProfiledInstr).super_Instr.field_0x38 =
       (pBVar4->super_ProfiledInstr).super_Instr.field_0x38 & 0xbf |
       ((byte)(this->super_ProfiledInstr).super_Instr.field_0x38 >> 6 & 1) << 6;
  pBVar4->auxBailOutKind = this->auxBailOutKind;
  pBVar4->bailOutInfo->wasCloned = true;
  pBVar4->bailOutInfo->bailOutInstr = (Instr *)pBVar4;
  return pBVar4;
}

Assistant:

BailOutInstrTemplate<InstrType> *
BailOutInstrTemplate<InstrType>::CloneBailOut() const
{
    Assert(this->m_func->hasBailout);
    Assert(!this->bailOutInfo->wasCloned);

    BailOutInstrTemplate * bailOutInstr = BailOutInstrTemplate::New(this->m_opcode, this->bailOutKind, this->bailOutInfo, this->bailOutInfo->bailOutFunc);
    bailOutInstr->hasAuxBailOut = this->hasAuxBailOut;
    bailOutInstr->auxBailOutKind = this->auxBailOutKind;
    bailOutInstr->bailOutInfo->wasCloned = true;

    // the new copy is in the slow path and generate the real bailout
    bailOutInstr->bailOutInfo->bailOutInstr = bailOutInstr;

    return bailOutInstr;
}